

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O3

void Fra_ManClean(Fra_Man_t *p,int nNodesMax)

{
  size_t __size;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t **ppVVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = p->nMemAlloc;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      __ptr = p->pMemFanins[lVar4];
      if ((Vec_Ptr_t *)0x1 < __ptr) {
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
        iVar3 = p->nMemAlloc;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  if (iVar3 < nNodesMax) {
    iVar3 = nNodesMax + 5000;
    __size = (long)nNodesMax * 8 + 40000;
    if (p->pMemFanins == (Vec_Ptr_t **)0x0) {
      ppVVar1 = (Vec_Ptr_t **)malloc(__size);
    }
    else {
      ppVVar1 = (Vec_Ptr_t **)realloc(p->pMemFanins,__size);
    }
    p->pMemFanins = ppVVar1;
    if (p->pMemSatNums == (int *)0x0) {
      piVar2 = (int *)malloc((long)iVar3 << 2);
    }
    else {
      piVar2 = (int *)realloc(p->pMemSatNums,(long)iVar3 << 2);
    }
    p->pMemSatNums = piVar2;
    p->nMemAlloc = iVar3;
  }
  memset(p->pMemFanins,0,(long)iVar3 << 3);
  memset(p->pMemSatNums,0,(long)p->nMemAlloc << 2);
  return;
}

Assistant:

void Fra_ManClean( Fra_Man_t * p, int nNodesMax )
{
    int i;
    // remove old arrays
    for ( i = 0; i < p->nMemAlloc; i++ )
        if ( p->pMemFanins[i] && p->pMemFanins[i] != (void *)1 )
            Vec_PtrFree( p->pMemFanins[i] );
    // realloc for the new size
    if ( p->nMemAlloc < nNodesMax )
    {
        int nMemAllocNew = nNodesMax + 5000;
        p->pMemFanins = ABC_REALLOC( Vec_Ptr_t *, p->pMemFanins, nMemAllocNew );
        p->pMemSatNums = ABC_REALLOC( int, p->pMemSatNums, nMemAllocNew );
        p->nMemAlloc = nMemAllocNew;
    }
    // prepare for the new run
    memset( p->pMemFanins, 0, sizeof(Vec_Ptr_t *) * p->nMemAlloc );
    memset( p->pMemSatNums, 0, sizeof(int) * p->nMemAlloc );
}